

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

Ref<embree::SceneGraph::LightNode> __thiscall
embree::SceneGraph::AnimatedLightNode::transform(AnimatedLightNode *this,AffineSpace3fa *space)

{
  undefined8 uVar1;
  size_type sVar2;
  pointer pRVar3;
  size_type in_RDX;
  long in_RSI;
  LightNode *in_RDI;
  size_t i;
  vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
  xfm_lights;
  allocator_type *in_stack_ffffffffffffff20;
  AnimatedLightNode *in_stack_ffffffffffffff28;
  BBox1f in_stack_ffffffffffffff30;
  undefined1 local_90 [64];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_50;
  AnimatedLightNode *local_38;
  pointer local_28;
  BBox1f local_20;
  pointer local_18;
  const_reference local_8;
  
  local_50._M_allocated_capacity = in_RDX;
  std::
  vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
  ::size((vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
          *)(in_RSI + 0x68));
  std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>::allocator
            ((allocator<embree::Ref<embree::SceneGraph::LightNode>_> *)0x30e539);
  std::
  vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
  ::vector((vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
            *)in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28,
           in_stack_ffffffffffffff20);
  std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>::~allocator
            ((allocator<embree::Ref<embree::SceneGraph::LightNode>_> *)0x30e55f);
  local_90._8_8_ = 0;
  while( true ) {
    uVar1 = local_90._8_8_;
    sVar2 = std::
            vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
            ::size((vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
                    *)(in_RSI + 0x68));
    if (sVar2 <= (ulong)uVar1) break;
    local_8 = std::
              vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
              ::operator[]((vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
                            *)(in_RSI + 0x68),local_90._8_8_);
    (*(local_8->ptr->super_Node).super_RefCount._vptr_RefCount[0x10])
              (local_90,local_8->ptr,local_50._M_allocated_capacity);
    in_stack_ffffffffffffff30 =
         (BBox1f)std::
                 vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
                 ::operator[]((vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
                               *)(local_90 + 0x28),local_90._8_8_);
    local_28 = (pointer)local_90;
    local_20 = in_stack_ffffffffffffff30;
    if (*(LightNode **)in_stack_ffffffffffffff30 != (LightNode *)0x0) {
      (*((*(LightNode **)in_stack_ffffffffffffff30)->super_Node).super_RefCount._vptr_RefCount[3])()
      ;
    }
    *(LightNode **)in_stack_ffffffffffffff30 = local_28->ptr;
    local_28->ptr = (LightNode *)0x0;
    in_stack_ffffffffffffff28 = (AnimatedLightNode *)local_90;
    local_38 = in_stack_ffffffffffffff28;
    if ((_func_int **)local_90._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_90._0_8_ + 0x18))();
    }
    local_90._8_8_ = local_90._8_8_ + 1;
  }
  pRVar3 = (pointer)::operator_new(0x88);
  AnimatedLightNode(in_stack_ffffffffffffff28,
                    (vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
                     *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff30);
  (in_RDI->super_Node).super_RefCount._vptr_RefCount = (_func_int **)pRVar3;
  local_18 = pRVar3;
  if ((in_RDI->super_Node).super_RefCount._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_Node).super_RefCount._vptr_RefCount + 0x10))();
  }
  std::
  vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
  ::~vector((vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
             *)in_stack_ffffffffffffff20);
  return (Ref<embree::SceneGraph::LightNode>)in_RDI;
}

Assistant:

virtual Ref<LightNode> transform(const AffineSpace3fa& space) const
      {
        std::vector<Ref<LightNode>> xfm_lights(lights.size());
        for (size_t i=0; i<lights.size(); i++)
          xfm_lights[i] = lights[i]->transform(space);
        return new AnimatedLightNode(std::move(xfm_lights), time_range);
      }